

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void socketreceiver_read(_socketreceiver *x,int fd)

{
  FILE *__stream;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  socklen_t local_30;
  socklen_t local_2c;
  int local_28;
  socklen_t fromaddrlen;
  int ret;
  int readto;
  char *semi;
  _socketreceiver *p_Stack_10;
  int fd_local;
  _socketreceiver *x_local;
  
  semi._4_4_ = fd;
  p_Stack_10 = x;
  if (x->sr_udp == 0) {
    if (x->sr_inhead < x->sr_intail) {
      local_30 = x->sr_intail - 1;
    }
    else {
      local_30 = 0x1000;
    }
    fromaddrlen = local_30;
    if (local_30 == x->sr_inhead) {
      fprintf(_stderr,"pd: dropped message from gui\n");
      p_Stack_10->sr_intail = 0;
      p_Stack_10->sr_inhead = 0;
    }
    else {
      sVar2 = recv(fd,x->sr_inbuf + x->sr_inhead,(long)(int)(local_30 - x->sr_inhead),0);
      local_28 = (int)sVar2;
      if (local_28 < 1) {
        if (local_28 < 0) {
          sys_sockerror("recv (tcp)");
        }
        __stream = _stderr;
        if (p_Stack_10 == (pd_maininstance.pd_inter)->i_socketreceiver) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(__stream,"read from GUI socket: %s; stopping\n",pcVar4);
          sys_bail(1);
        }
        else {
          if (p_Stack_10->sr_notifier != (t_socketnotifier)0x0) {
            (*p_Stack_10->sr_notifier)(p_Stack_10->sr_owner,semi._4_4_);
          }
          sys_rmpollfn(semi._4_4_);
          sys_closesocket(semi._4_4_);
        }
      }
      else {
        p_Stack_10->sr_inhead = local_28 + p_Stack_10->sr_inhead;
        if (0xfff < p_Stack_10->sr_inhead) {
          p_Stack_10->sr_inhead = 0;
        }
        do {
          iVar1 = socketreceiver_doread(p_Stack_10);
          if (iVar1 == 0) {
            return;
          }
          if (p_Stack_10->sr_fromaddrfn != (t_socketfromaddrfn)0x0) {
            local_2c = 0x80;
            iVar1 = getpeername(semi._4_4_,(sockaddr *)p_Stack_10->sr_fromaddr,&local_2c);
            if (iVar1 == 0) {
              (*p_Stack_10->sr_fromaddrfn)(p_Stack_10->sr_owner,p_Stack_10->sr_fromaddr);
            }
          }
          outlet_setstacklim();
          if (p_Stack_10->sr_socketreceivefn == (t_socketreceivefn)0x0) {
            binbuf_eval((pd_maininstance.pd_inter)->i_inbinbuf,(t_pd *)0x0,0,(t_atom *)0x0);
          }
          else {
            (*p_Stack_10->sr_socketreceivefn)
                      (p_Stack_10->sr_owner,(pd_maininstance.pd_inter)->i_inbinbuf);
          }
        } while (p_Stack_10->sr_inhead != p_Stack_10->sr_intail);
      }
    }
  }
  else {
    socketreceiver_getudp(x,fd);
  }
  return;
}

Assistant:

void socketreceiver_read(t_socketreceiver *x, int fd)
{
    if (x->sr_udp)   /* UDP ("datagram") socket protocol */
        socketreceiver_getudp(x, fd);
    else  /* TCP ("streaming") socket protocol */
    {
        char *semi;
        int readto =
            (x->sr_inhead >= x->sr_intail ? INBUFSIZE : x->sr_intail-1);
        int ret;

            /* the input buffer might be full. If so, drop the whole thing */
        if (readto == x->sr_inhead)
        {
            fprintf(stderr, "pd: dropped message from gui\n");
            x->sr_inhead = x->sr_intail = 0;
            readto = INBUFSIZE;
        }
        else
        {
            ret = (int)recv(fd, x->sr_inbuf + x->sr_inhead,
                readto - x->sr_inhead, 0);
            if (ret <= 0)
            {
                if (ret < 0)
                    sys_sockerror("recv (tcp)");
                if (x == INTER->i_socketreceiver)
                {
                    if (pd_this == &pd_maininstance)
                    {
                        fprintf(stderr, "read from GUI socket: %s; stopping\n",
                            strerror(errno));
                        sys_bail(1);
                    }
                    else
                    {
                        sys_rmpollfn(fd);
                        sys_closesocket(fd);
                        sys_stopgui();
                    }
                }
                else
                {
                    if (x->sr_notifier)
                        (*x->sr_notifier)(x->sr_owner, fd);
                    sys_rmpollfn(fd);
                    sys_closesocket(fd);
                }
            }
            else
            {
                x->sr_inhead += ret;
                if (x->sr_inhead >= INBUFSIZE) x->sr_inhead = 0;
                while (socketreceiver_doread(x))
                {
                    if (x->sr_fromaddrfn)
                    {
                        socklen_t fromaddrlen = sizeof(struct sockaddr_storage);
                        if(!getpeername(fd,
                                        (struct sockaddr *)x->sr_fromaddr,
                                        &fromaddrlen))
                            (*x->sr_fromaddrfn)(x->sr_owner,
                                (const void *)x->sr_fromaddr);
                    }
                    outlet_setstacklim();
                    if (x->sr_socketreceivefn)
                        (*x->sr_socketreceivefn)(x->sr_owner,
                            INTER->i_inbinbuf);
                    else binbuf_eval(INTER->i_inbinbuf, 0, 0, 0);
                    if (x->sr_inhead == x->sr_intail)
                        break;
                }
            }
        }
    }
}